

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O0

void __thiscall
polyscope::render::ManagedBuffer<int>::setTextureSize(ManagedBuffer<int> *this,uint32_t sizeX_)

{
  undefined4 in_ESI;
  long in_RDI;
  string *in_stack_00000010;
  allocator local_31;
  string local_30 [36];
  undefined4 local_c;
  
  local_c = in_ESI;
  if (*(int *)(in_RDI + 0x90) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_30,"managed buffer can only be set as texture once",&local_31);
    exception(in_stack_00000010);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  *(undefined4 *)(in_RDI + 0x90) = 1;
  *(undefined4 *)(in_RDI + 0x94) = local_c;
  return;
}

Assistant:

void ManagedBuffer<T>::setTextureSize(uint32_t sizeX_) {
  if (deviceBufferType != DeviceBufferType::Attribute) exception("managed buffer can only be set as texture once");

  deviceBufferType = DeviceBufferType::Texture1d;
  sizeX = sizeX_;
}